

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec07.c
# Opt level: O1

word If_Dec5Perform(word t,int fDerive)

{
  long lVar1;
  undefined8 uVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  word z;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  ulong uVar12;
  short sVar13;
  uint uVar14;
  int iVar15;
  ulong uVar16;
  uint uVar17;
  ulong uVar18;
  int iVar19;
  word wVar20;
  uint uVar21;
  ulong uVar22;
  bool bVar23;
  int Pla2Var [7];
  word D2 [4];
  word D;
  word C;
  word C2 [4];
  int Var2Pla [7];
  undefined8 uStack_160;
  uint local_158 [10];
  ulong local_130;
  word local_128;
  ulong local_120;
  long local_118;
  ulong local_110;
  word local_108;
  int local_fc;
  ulong local_f8;
  ulong uStack_f0;
  ulong local_e8;
  ulong auStack_e0 [2];
  word local_d0;
  ulong local_c8;
  ulong local_c0;
  ulong local_b8;
  ulong local_b0;
  ulong local_a8;
  ulong local_a0 [2];
  ulong local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  undefined8 local_60;
  uint auStack_58 [10];
  
  local_fc = fDerive;
  lVar1 = 0;
  do {
    auStack_58[lVar1] = (uint)lVar1;
    local_158[lVar1] = (uint)lVar1;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 7);
  uVar18 = 0;
  local_128 = t;
  uVar2 = 7;
  uVar22 = t;
  do {
    uVar9 = auStack_58[uVar18];
    if ((int)uVar9 < 0) {
      uStack_160 = If_Dec5PerformEx;
      __assert_fail("Var2Pla[v] >= p",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec07.c"
                    ,0xf0,"word If_Dec6MoveTo(word, int, int, int *, int *)");
    }
    while (uVar9 != 0) {
      if (5 < (int)uVar9) {
        uStack_160 = (code *)0x41403c;
        __assert_fail("v < 5",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec07.c"
                      ,0xea,"word If_Dec6SwapAdjacent(word, int)");
      }
      lVar1 = (long)(int)uVar9;
      uVar6 = PMasks[lVar1 + -1][0];
      uVar12 = PMasks[lVar1 + -1][1];
      bVar3 = (byte)(1 << ((char)uVar9 - 1U & 0x1f));
      uVar8 = PMasks[lVar1 + -1][2];
      uVar9 = *(uint *)((long)&uStack_160 + lVar1 * 4 + 4);
      auStack_58[(int)uVar9] = auStack_58[(int)uVar9] + 1;
      uVar11 = local_158[lVar1];
      auStack_58[(int)uVar11] = auStack_58[(int)uVar11] - 1;
      uVar22 = (uVar22 & uVar8) >> (bVar3 & 0x3f) |
               (uVar12 & uVar22) << (bVar3 & 0x3f) | uVar6 & uVar22;
      *(uint *)((long)&uStack_160 + lVar1 * 4 + 4) = uVar11 ^ uVar9;
      local_158[lVar1] = uVar9;
      *(uint *)((long)&uStack_160 + lVar1 * 4 + 4) = uVar11;
      uVar9 = auStack_58[uVar18];
    }
    local_130 = (ulong)local_158[0];
    if (uVar18 != local_130) {
      uStack_160 = (code *)0x414099;
      __assert_fail("Pla2Var[p] == v",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec07.c"
                    ,0xfc,"word If_Dec6MoveTo(word, int, int, int *, int *)");
    }
    uVar6 = 0;
    do {
      if (uVar6 != local_158[(int)auStack_58[uVar6]]) {
        uStack_160 = (code *)0x41401d;
        __assert_fail("Pla2Var[Var2Pla[i]] == i",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec07.c"
                      ,0x1a2,"void If_DecVerifyPerm(int *, int *)");
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 != 6);
    local_90 = uVar18;
    local_130 = local_130 << 0x30;
    uVar6 = 1;
    uVar18 = 0;
    do {
      local_88 = uVar6;
      if (uVar18 < 3) {
        uVar12 = uVar18 - 1;
        local_68 = uVar12;
        uVar8 = uVar18;
        wVar20 = t;
        do {
          t = local_128;
          local_110 = uVar8;
          local_108 = wVar20;
          uVar10 = 0;
          do {
            uVar11 = 0;
            lVar1 = 0;
            uVar9 = 0;
            do {
              bVar3 = (byte)uVar18;
              uVar21 = (uint)uVar6;
              if ((((uVar11 >> (bVar3 & 0x1f) ^ (uint)uVar10) & 1) == 0) &&
                 ((uint)((uVar11 >> (uVar21 & 0x1f) & 1) != 0) == (uint)(uVar10 >> 1))) {
                uVar9 = uVar9 | 1 << ((byte)(uVar22 >> ((byte)lVar1 & 0x3f)) & 3);
              }
              lVar1 = lVar1 + 2;
              uVar11 = uVar11 + 1;
            } while (lVar1 != 0x20);
            if (2 < BitCount8[uVar9 & 0xf]) {
              z = 0;
              t = wVar20;
              goto LAB_00413f72;
            }
            uVar9 = (uint)uVar10 + 1;
            uVar10 = (ulong)uVar9;
          } while (uVar9 != 4);
          if (local_fc == 0) {
            z = 1;
            t = wVar20;
          }
          else {
            local_e8 = 0;
            auStack_e0[0] = 0;
            local_f8 = 0;
            uStack_f0 = 0;
            uVar10 = 0;
            do {
              if (uVar18 != uVar10 && uVar6 != uVar10) goto LAB_004137a7;
              uVar10 = uVar10 + 1;
            } while ((int)uVar10 != 4);
            uVar10 = 0xffffffff;
LAB_004137a7:
            uVar9 = (uint)uVar10;
            lVar1 = (long)(int)uVar9;
            uVar10 = 0;
            do {
              if (((uVar9 - 1 != (int)uVar10) && (uVar12 != uVar10)) && (uVar8 != uVar10)) {
                iVar19 = (int)uVar10 + 1;
                goto LAB_004137e5;
              }
              uVar10 = uVar10 + 1;
            } while ((int)uVar10 != 3);
            iVar19 = -1;
LAB_004137e5:
            if ((uVar9 == 0xffffffff) || (iVar19 == -1)) {
              uStack_160 = (code *)0x41407a;
              __assert_fail("zz1 != -1 && zz2 != -1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec07.c"
                            ,0x2d0,"word If_Dec5CofCount2(word, int, int, int *, word, int)");
            }
            local_118 = lVar1;
            local_60 = uVar2;
            uVar12 = 0;
            do {
              uVar11 = (uint)(uVar12 >> 1) & 0x7fffffff;
              uVar17 = 0;
              lVar7 = 0;
              uVar8 = 0;
              do {
                if ((((uVar17 >> (bVar3 & 0x1f) ^ (uint)uVar12) & 1) == 0) &&
                   (((uVar17 >> (uVar21 & 0x1f) & 1) != 0) == uVar11)) {
                  uVar8 = (ulong)((uint)uVar8 | 1 << ((byte)(uVar22 >> ((byte)lVar7 & 0x3f)) & 3));
                }
                uVar14 = (uint)uVar8;
                lVar7 = lVar7 + 2;
                uVar17 = uVar17 + 1;
              } while (lVar7 != 0x20);
              sVar13 = (short)uVar8;
              if (BitCount8[uVar14 & 0xf] == 2) {
                if (uVar14 == 0) {
                  iVar4 = -1;
                }
                else {
                  uVar10 = uVar8;
                  if (sVar13 == 0) {
                    uVar10 = 0;
                  }
                  iVar4 = (uint)(sVar13 == 0) * 0x10;
                  iVar5 = iVar4 + 8;
                  uVar16 = 0;
                  if ((char)uVar10 != '\0') {
                    iVar5 = iVar4;
                    uVar16 = uVar10;
                  }
                  if ((uVar16 & 0xf) == 0) {
                    uVar16 = 0;
                    iVar5 = iVar5 + 4;
                  }
                  uVar17 = (uint)(uVar16 >> 2);
                  iVar4 = iVar5 + 2;
                  if ((uVar16 & 3) != 0) {
                    uVar17 = (uint)uVar16;
                    iVar4 = iVar5;
                  }
                  iVar4 = (~uVar17 & 1) + iVar4;
                }
                uVar10 = 1L << ((byte)iVar4 & 0x3f);
                uVar16 = 0xffffffffffffffff;
                if (uVar10 != uVar8) {
                  bVar23 = (int)(uVar8 ^ uVar10) == 0;
                  uVar16 = uVar10 >> 0x20;
                  if (!bVar23) {
                    uVar16 = uVar8 ^ uVar10;
                  }
                  iVar15 = (uint)bVar23 * 0x20;
                  iVar5 = iVar15 + 0x10;
                  uVar8 = uVar16 >> 0x10;
                  if ((short)uVar16 != 0) {
                    iVar5 = iVar15;
                    uVar8 = uVar16;
                  }
                  iVar15 = iVar5 + 8;
                  uVar10 = uVar8 >> 8;
                  if ((char)uVar8 != '\0') {
                    iVar15 = iVar5;
                    uVar10 = uVar8;
                  }
                  iVar5 = iVar15 + 4;
                  uVar8 = uVar10 >> 4;
                  if ((uVar10 & 0xf) != 0) {
                    iVar5 = iVar15;
                    uVar8 = uVar10;
                  }
                  uVar17 = (uint)(uVar8 >> 2) & 0x3fffffff;
                  iVar15 = iVar5 + 2;
                  if ((uVar8 & 3) != 0) {
                    uVar17 = (uint)uVar8;
                    iVar15 = iVar5;
                  }
                  uVar16 = (ulong)((~uVar17 & 1) + iVar15);
                }
                (&local_b8)[uVar12] =
                     *(ulong *)(&DAT_009ad4d0 + (long)iVar4 * 8) & 0x3333333333333333 |
                     *(ulong *)(&DAT_009ad4d0 + uVar16 * 8) & 0xcccccccccccccccc;
                uVar17 = 0;
                lVar7 = 0;
                do {
                  if (((((uVar17 >> (bVar3 & 0x1f) ^ (uint)uVar12) & 1) == 0) &&
                      (((uVar17 >> (uVar21 & 0x1f) & 1) != 0) == uVar11)) &&
                     (((uint)(uVar22 >> ((byte)lVar7 & 0x3f)) & 3) == uVar16)) {
                    (&local_f8)[uVar12] =
                         (&local_f8)[uVar12] |
                         1L << ((uVar17 >> (uVar9 & 0x1f) & 1) != 0) +
                               ((byte)(uVar17 >> ((byte)iVar19 & 0x1f)) & 1) * '\x02';
                  }
                  lVar7 = lVar7 + 2;
                  uVar17 = uVar17 + 1;
                } while (lVar7 != 0x20);
              }
              else {
                if (BitCount8[uVar14 & 0xf] != 1) {
                  uStack_160 = (code *)0x413ffe;
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec07.c"
                                ,0x2e9,"word If_Dec5CofCount2(word, int, int, int *, word, int)");
                }
                if (uVar14 == 0) {
                  uVar8 = 0xffffffffffffffff;
                }
                else {
                  if (sVar13 == 0) {
                    uVar14 = 0;
                  }
                  iVar5 = (uint)(sVar13 == 0) * 0x10;
                  iVar4 = iVar5 + 8;
                  uVar11 = 0;
                  if ((char)uVar14 != '\0') {
                    iVar4 = iVar5;
                    uVar11 = uVar14;
                  }
                  if ((uVar11 & 0xf) == 0) {
                    uVar11 = 0;
                    iVar4 = iVar4 + 4;
                  }
                  uVar17 = uVar11 >> 2;
                  iVar5 = iVar4 + 2;
                  if ((uVar11 & 3) != 0) {
                    uVar17 = uVar11;
                    iVar5 = iVar4;
                  }
                  uVar8 = (ulong)((~uVar17 & 1) + iVar5);
                }
                (&local_b8)[uVar12] = *(ulong *)(&DAT_009ad4d0 + uVar8 * 8);
                (&local_f8)[uVar12] = 0xffffffffffffffff;
              }
              (&local_f8)[uVar12] = (ulong)((uint)(&local_f8)[uVar12] & 0xf) * 0x1111111111111111;
              uVar12 = uVar12 + 1;
            } while (uVar12 != 4);
            local_70 = local_b0 & 0xf000f000f000f0;
            local_78 = local_b8 & 0xf000f000f000f;
            local_120 = local_78 | local_70;
            local_80 = local_a0[0] & 0xf000f000f000f000;
            uVar16 = local_a8 & 0xf000f000f000f00 | local_80;
            local_c0 = uVar16 | local_120;
            uVar8 = local_f8 & 0xf000f000f000f | uStack_f0 & 0xf000f000f000f0;
            uVar10 = local_e8 & 0xf000f000f000f00 | auStack_e0[0] & 0xf000f000f000f000;
            local_c8 = uVar10 | uVar8;
            uVar12 = local_c8 >> 4 ^ local_c8;
            uVar10 = uVar10 >> 8;
            if (((uVar12 & 0xf0f0f0f0f0f0f0f) == 0) || (uVar10 == uVar8)) {
              bVar23 = (uVar12 & 0xf0f0f0f0f0f0f0f) != 0;
              if ((bVar23) && (uVar10 == uVar8)) {
                uVar12 = (long)(int)local_158[uVar18 + 1] << 0x18 |
                         (long)(int)local_158[(long)iVar19 + 1] << 0x14 |
                         (long)(int)local_158[lVar1 + 1] << 0x10 | local_c8 & 0xffff | 0x60000000;
              }
              else if (bVar23 || uVar10 == uVar8) {
                uVar12 = (long)(int)local_158[(long)iVar19 + 1] << 0x14 |
                         (long)(int)local_158[lVar1 + 1] << 0x10 | local_c8 & 0xffff | 0x66000000;
              }
              else {
                local_c8 = (uStack_f0 & 0xf000f000f000f0) << 4 | local_f8 & 0xf000f000f000f |
                           auStack_e0[0] & 0xf000f000f000f000 | (local_e8 & 0xf000f000f000f00) >> 4;
                uVar12 = (long)(int)local_158[uVar6 + 1] << 0x18 |
                         (long)(int)local_158[(long)iVar19 + 1] << 0x14 |
                         (long)(int)local_158[lVar1 + 1] << 0x10 | local_c8 & 0xffff | 0x60000000;
              }
            }
            else {
              uVar12 = (long)(int)local_158[uVar6 + 1] << 0x1c |
                       (long)(int)local_158[uVar18 + 1] << 0x18 |
                       (long)(int)local_158[(long)iVar19 + 1] << 0x14 |
                       (long)(int)local_158[lVar1 + 1] << 0x10 | local_c8 & 0xffff;
            }
            uVar8 = local_c0 >> 4 ^ local_c0;
            uVar16 = uVar16 >> 8;
            if (((uVar8 & 0xf0f0f0f0f0f0f0f) == 0) || (uVar16 == local_120)) {
              bVar23 = (uVar8 & 0xf0f0f0f0f0f0f0f) == 0;
              if ((bVar23) || (uVar16 != local_120)) {
                if (!bVar23 || uVar16 == local_120) {
                  uVar10 = (local_c0 & 0xffff) << 0x20 | local_130;
                  uVar8 = 0x6670000000000000;
                  goto LAB_00413dc5;
                }
                local_c0 = local_70 << 4 | local_78 | local_80 | (local_a8 & 0xf000f000f000f00) >> 4
                ;
                uVar9 = local_158[uVar6 + 1];
              }
              else {
                uVar9 = local_158[uVar18 + 1];
              }
              uVar10 = (ulong)uVar9 << 0x38 | local_130 | (local_c0 & 0xffff) << 0x20;
              uVar8 = 0x6070000000000000;
            }
            else {
              uVar10 = (ulong)local_158[uVar18 + 1] << 0x38 | local_130 |
                       (ulong)local_158[uVar6 + 1] << 0x3c | (local_c0 & 0xffff) << 0x20;
              uVar8 = 0x70000000000000;
            }
LAB_00413dc5:
            z = uVar10 | uVar12 | uVar8;
            uStack_160 = (code *)0x413dd3;
            local_d0 = If_Dec6Truth(z);
            if (local_d0 != local_108) {
              uStack_160 = (code *)0x413df0;
              putchar(10);
              uStack_160 = (code *)0x413e02;
              Kit_DsdPrintFromTruth((uint *)&local_b8,5);
              uStack_160 = (code *)0x413e0c;
              putchar(10);
              uStack_160 = (code *)0x413e1e;
              Kit_DsdPrintFromTruth((uint *)&local_b0,5);
              uStack_160 = (code *)0x413e28;
              putchar(10);
              uStack_160 = (code *)0x413e3a;
              Kit_DsdPrintFromTruth((uint *)&local_a8,5);
              uStack_160 = (code *)0x413e44;
              putchar(10);
              uStack_160 = (code *)0x413e56;
              Kit_DsdPrintFromTruth((uint *)local_a0,5);
              uStack_160 = (code *)0x413e60;
              putchar(10);
              uStack_160 = (code *)0x413e6a;
              putchar(10);
              uStack_160 = (code *)0x413e79;
              Kit_DsdPrintFromTruth((uint *)&local_f8,5);
              uStack_160 = (code *)0x413e83;
              putchar(10);
              uStack_160 = (code *)0x413e92;
              Kit_DsdPrintFromTruth((uint *)&uStack_f0,5);
              uStack_160 = (code *)0x413e9c;
              putchar(10);
              uStack_160 = (code *)0x413eab;
              Kit_DsdPrintFromTruth((uint *)&local_e8,5);
              uStack_160 = (code *)0x413eb5;
              putchar(10);
              uStack_160 = (code *)0x413ec4;
              Kit_DsdPrintFromTruth((uint *)auStack_e0,5);
              uStack_160 = (code *)0x413ece;
              putchar(10);
              uStack_160 = (code *)0x413ed8;
              putchar(10);
              uStack_160 = (code *)0x413eea;
              Kit_DsdPrintFromTruth((uint *)&local_c0,5);
              uStack_160 = (code *)0x413ef4;
              putchar(10);
              uStack_160 = (code *)0x413f06;
              Kit_DsdPrintFromTruth((uint *)&local_c8,5);
              uStack_160 = (code *)0x413f10;
              putchar(10);
              uStack_160 = (code *)0x413f1a;
              putchar(10);
              uStack_160 = (code *)0x413f2c;
              Kit_DsdPrintFromTruth((uint *)&local_d0,5);
              uStack_160 = (code *)0x413f36;
              putchar(10);
              uStack_160 = (code *)0x413f45;
              Kit_DsdPrintFromTruth((uint *)&local_108,5);
              uStack_160 = (code *)0x413f4f;
              putchar(10);
            }
            uVar2 = local_60;
            uVar12 = local_68;
            if (local_d0 != local_108) {
              uStack_160 = (code *)0x41405b;
              __assert_fail("t1 == t0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec07.c"
                            ,0x35f,"word If_Dec5CofCount2(word, int, int, int *, word, int)");
            }
          }
LAB_00413f72:
          if (z != 0) {
            return z;
          }
          uVar6 = uVar6 + 1;
          uVar8 = local_110 + 1;
          wVar20 = t;
        } while (uVar6 != 4);
      }
      uVar18 = uVar18 + 1;
      uVar6 = local_88 + 1;
    } while (uVar18 != 4);
    uVar18 = local_90 + 1;
    if (uVar18 == 5) {
      return 0;
    }
  } while( true );
}

Assistant:

word If_Dec5Perform( word t, int fDerive )
{
    int Pla2Var[7], Var2Pla[7];
    int i, j, v;
    word t0 = t;
/*
    word c0, c1, c00, c01, c10, c11;
    for ( i = 0; i < 5; i++ )
    {
        c0 = If_Dec6Cofactor( t, i, 0 );
        c1 = If_Dec6Cofactor( t, i, 1 );
        if ( c0 == 0 )
            return 1;
        if ( ~c0 == 0 )
            return 1;
        if ( c1 == 0 )
            return 1;
        if ( ~c1 == 0 )
            return 1;
       if ( c0 == ~c1 )
            return 1;
    }
    for ( i = 0; i < 4; i++ )
    {
        c0 = If_Dec6Cofactor( t, i, 0 );
        c1 = If_Dec6Cofactor( t, i, 1 );
        for ( j = i + 1; j < 5; j++ )
        {
            c00 = If_Dec6Cofactor( c0, j, 0 );
            c01 = If_Dec6Cofactor( c0, j, 1 );
            c10 = If_Dec6Cofactor( c1, j, 0 );
            c11 = If_Dec6Cofactor( c1, j, 1 );
            if ( c00 == c01 && c00 == c10 )
                return 1;
            if ( c11 == c01 && c11 == c10 )
                return 1;
            if ( c11 == c00 && c11 == c01 )
                return 1;
            if ( c11 == c00 && c11 == c10 )
                return 1;
            if ( c00 == c11 && c01 == c10 )
                return 1;
        }
    }
*/
    // start arrays
    for ( i = 0; i < 7; i++ )
        Pla2Var[i] = Var2Pla[i] = i;
    // generate permutations
    for ( v = 0; v < 5; v++ )
    {
        t = If_Dec6MoveTo( t, v, 0, Pla2Var, Var2Pla );
        If_DecVerifyPerm( Pla2Var, Var2Pla );
        for ( i = 0; i < 4; i++ )
            for ( j = i + 1; j < 4; j++ )
            {
                word z = If_Dec5CofCount2( t, i, j, Pla2Var, t0, fDerive );
                if ( z )
                {
/*
                    if ( v == 0 && i == 1 && j == 2 )
                    {
                          Kit_DsdPrintFromTruth( (unsigned *)&t, 5 ); printf( "\n" );
                    }
*/
                    return z;
                }
            }
    }

/*
    // start arrays
    for ( i = 0; i < 7; i++ )
        Pla2Var[i] = Var2Pla[i] = i;

    t = t0;
    for ( v = 0; v < 5; v++ )
    {
        int x, y;

        t = If_Dec6MoveTo( t, v, 0, Pla2Var, Var2Pla );
        If_DecVerifyPerm( Pla2Var, Var2Pla );

        for ( i = 0; i < 16; i++ )
            printf( "%d ", ((t >> (i<<1)) & 3) );
        printf( "\n" );

        for ( x = 0; x < 4; x++ )
        for ( y = x + 1; y < 4; y++ )
        {
            for ( i = 0; i < 16; i++ )
                if ( !((i >> x) & 1) && !((i >> y) & 1) )
                    printf( "%d ", ((t >> (i<<1)) & 3) );
            printf( "\n" );

            for ( i = 0; i < 16; i++ )
                if ( ((i >> x) & 1) && !((i >> y) & 1) )
                    printf( "%d ", ((t >> (i<<1)) & 3) );
            printf( "\n" );

            for ( i = 0; i < 16; i++ )
                if ( !((i >> x) & 1) && ((i >> y) & 1) )
                    printf( "%d ", ((t >> (i<<1)) & 3) );
            printf( "\n" );

            for ( i = 0; i < 16; i++ )
                if ( ((i >> x) & 1) && ((i >> y) & 1) )
                    printf( "%d ", ((t >> (i<<1)) & 3) );
            printf( "\n" );
            printf( "\n" );
        }
    }
*/

//    Kit_DsdPrintFromTruth( (unsigned *)&t, 5 ); printf( "\n" );
    return 0;
}